

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_0::RelativeChangeCase::logAnalysis
          (RelativeChangeCase *this,
          vector<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
          *samples)

{
  ostringstream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  long lVar2;
  long lVar3;
  pointer pSVar4;
  int precision;
  ulong uVar5;
  float fVar6;
  float fVar7;
  LineParametersWithConfidence baseParam;
  LineParametersWithConfidence testParam;
  LineParametersWithConfidence nullParam;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> testSamples;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> baseSamples;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> nullSamples;
  LineParametersWithConfidence local_284;
  LineParametersWithConfidence local_268;
  LineParametersWithConfidence local_24c;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_230;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_218;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_200;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [4];
  ios_base local_170 [264];
  string local_68;
  string local_48;
  
  this_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((this->super_BaseCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&local_200,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)local_1e8);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&local_218,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)local_1e8);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&local_230,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)local_1e8);
  pSVar4 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((samples->
      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
      )._M_impl.super__Vector_impl_data._M_finish != pSVar4) {
    lVar3 = 0x1c;
    uVar5 = 0;
    do {
      lVar2 = *(long *)((long)pSVar4 + lVar3 + -0x1c);
      local_200.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar5].m_data[0] =
           (float)*(int *)((long)&pSVar4->nullTime + lVar3);
      local_200.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar5].m_data[1] = (float)lVar2;
      lVar2 = *(long *)((long)pSVar4 + lVar3 + -0x14);
      local_218.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar5].m_data[0] =
           (float)*(int *)((long)&pSVar4->nullTime + lVar3);
      local_218.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar5].m_data[1] = (float)lVar2;
      lVar2 = *(long *)((long)pSVar4 + lVar3 + -0xc);
      local_230.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar5].m_data[0] =
           (float)*(int *)((long)&pSVar4->nullTime + lVar3);
      local_230.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar5].m_data[1] = (float)lVar2;
      uVar5 = uVar5 + 1;
      pSVar4 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x20;
    } while (uVar5 < (ulong)((long)(samples->
                                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::Sample,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::Sample>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 >> 5))
    ;
  }
  deqp::gls::theilSenSiegelLinearRegression(&local_24c,&local_200,0.6);
  deqp::gls::theilSenSiegelLinearRegression(&local_284,&local_218,0.6);
  deqp::gls::theilSenSiegelLinearRegression(&local_268,&local_230,0.6);
  if ((0.0 < local_24c.coefficientConfidenceLower) || (local_24c.coefficientConfidenceUpper < 0.0))
  {
    local_1e8._0_8_ = &local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"Constant operation sequence duration not constant","");
    tcu::ResultCollector::addResult
              (&(this->super_BaseCase).m_results,QP_TEST_RESULT_FAIL,(string *)local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._0_8_ != &local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8._M_allocated_capacity + 1);
    }
    poVar1 = (ostringstream *)(local_1e8 + 8);
    local_1e8._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Constant operation sequence timing may vary as a function of workload. Result quality extremely low"
               ,99);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
  }
  if ((local_284.coefficientConfidenceLower <= 0.0) && (0.0 <= local_284.coefficientConfidenceUpper)
     ) {
    local_1e8._0_8_ = &local_1d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"Workload has no effect on duration","");
    tcu::ResultCollector::addResult
              (&(this->super_BaseCase).m_results,QP_TEST_RESULT_FAIL,(string *)local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._0_8_ != &local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8._M_allocated_capacity + 1);
    }
    poVar1 = (ostringstream *)(local_1e8 + 8);
    local_1e8._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Workload factor has no effect on duration of sample (smart optimizer?)",0x46);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Linear Regression","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Linear Regression","");
  tcu::LogSection::LogSection((LogSection *)local_1e8,&local_48,&local_68);
  tcu::TestLog::startSection
            ((TestLog *)&this_00->_M_allocated_capacity,(char *)local_1e8._0_8_,local_1c8._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != local_1b8) {
    operator_delete(local_1c8._M_p,local_1b8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._0_8_ != &local_1d8) {
    operator_delete((void *)local_1e8._0_8_,local_1d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  poVar1 = (ostringstream *)(local_1e8 + 8);
  local_1e8._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Offset & coefficient presented as [confidence interval min, estimate, confidence interval max]. Reported confidence interval for this test is "
             ,0x8e);
  std::ostream::_M_insert<double>(0.6000000238418579);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_170);
  poVar1 = (ostringstream *)(local_1e8 + 8);
  local_1e8._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Render time for empty scene was\n\t",0x21);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
  std::ostream::_M_insert<double>((double)local_24c.offsetConfidenceLower);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)local_24c.offset);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)local_24c.offsetConfidenceUpper);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]us +",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
  std::ostream::_M_insert<double>((double)local_24c.coefficientConfidenceLower);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)local_24c.coefficient);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)local_24c.coefficientConfidenceUpper);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"us/workload",0xb);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_170);
  poVar1 = (ostringstream *)(local_1e8 + 8);
  local_1e8._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Render time for scene without depth test was\n\t",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
  std::ostream::_M_insert<double>((double)local_284.offsetConfidenceLower);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)local_284.offset);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)local_284.offsetConfidenceUpper);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]us +",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
  std::ostream::_M_insert<double>((double)local_284.coefficientConfidenceLower);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)local_284.coefficient);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)local_284.coefficientConfidenceUpper);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"us/workload",0xb);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_170);
  poVar1 = (ostringstream *)(local_1e8 + 8);
  local_1e8._0_8_ = this_00;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Render time for scene with depth test was\n\t",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
  std::ostream::_M_insert<double>((double)local_268.offsetConfidenceLower);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)local_268.offset);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)local_268.offsetConfidenceUpper);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]us +",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[",1);
  std::ostream::_M_insert<double>((double)local_268.coefficientConfidenceLower);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)local_268.coefficient);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::_M_insert<double>((double)local_268.coefficientConfidenceUpper);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"us/workload",0xb);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_170);
  tcu::TestLog::endSection((TestLog *)&this_00->_M_allocated_capacity);
  if ((0.0 < local_268.coefficientConfidenceLower) || (local_268.coefficientConfidenceUpper < 0.0))
  {
    if (local_268.coefficientConfidenceUpper * 0.25 <= local_268.coefficientConfidenceLower) {
      poVar1 = (ostringstream *)(local_1e8 + 8);
      if (local_284.coefficientConfidenceUpper * 0.25 <= local_284.coefficientConfidenceLower) {
        local_1e8._0_8_ = this_00;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Test duration is dependent on culled workload",0x2d);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_170);
        fVar6 = -local_268.coefficient;
        if (-local_268.coefficient <= local_268.coefficient) {
          fVar6 = local_268.coefficient;
        }
        fVar7 = -local_284.coefficient;
        if (-local_284.coefficient <= local_284.coefficient) {
          fVar7 = local_284.coefficient;
        }
        de::floatToString_abi_cxx11_((string *)local_1e8,(de *)0x2,fVar6 / fVar7,precision);
        tcu::ResultCollector::addResult
                  (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,(string *)local_1e8);
      }
      else {
        local_1e8._0_8_ = this_00;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "Coefficient confidence range for base render time is extremely large, cannot give reliable result"
                   ,0x61);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_170);
        local_1e8._0_8_ = &local_1d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"Result confidence extremely low","");
        tcu::ResultCollector::addResult
                  (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,(string *)local_1e8);
      }
    }
    else {
      poVar1 = (ostringstream *)(local_1e8 + 8);
      local_1e8._0_8_ = this_00;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "Coefficient confidence range is extremely large, cannot give reliable result",0x4c
                );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_170);
      local_1e8._0_8_ = &local_1d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e8,"Result confidence extremely low","");
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,(string *)local_1e8);
    }
  }
  else {
    poVar1 = (ostringstream *)(local_1e8 + 8);
    local_1e8._0_8_ = this_00;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Test duration not dependent on culled workload",0x2e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    local_1e8._0_8_ = &local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"0.0","");
    tcu::ResultCollector::addResult
              (&(this->super_BaseCase).m_results,QP_TEST_RESULT_PASS,(string *)local_1e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._0_8_ != &local_1d8) {
    operator_delete((void *)local_1e8._0_8_,local_1d8._M_allocated_capacity + 1);
  }
  if (local_230.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_230.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_230.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_218.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_218.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_200.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_200.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_200.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_200.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void RelativeChangeCase::logAnalysis (const vector<Sample>& samples)
{
	using namespace gls;

	TestLog&		log			= m_testCtx.getLog();

	int				maxWorkload	= 0;

	vector<Vec2>	nullSamples	(samples.size());
	vector<Vec2>	baseSamples	(samples.size());
	vector<Vec2>	testSamples	(samples.size());

	for (size_t ndx = 0; ndx < samples.size(); ndx++)
	{
		const Sample& sample = samples[ndx];

		nullSamples[ndx] = Vec2((float)sample.workload, (float)sample.nullTime);
		baseSamples[ndx] = Vec2((float)sample.workload, (float)sample.baseTime);
		testSamples[ndx] = Vec2((float)sample.workload, (float)sample.testTime);

		maxWorkload = de::max(maxWorkload, sample.workload);
	}

	{
		const float							confidence	= 0.60f;

		const LineParametersWithConfidence	nullParam	= theilSenSiegelLinearRegression(nullSamples, confidence);
		const LineParametersWithConfidence	baseParam	= theilSenSiegelLinearRegression(baseSamples, confidence);
		const LineParametersWithConfidence	testParam	= theilSenSiegelLinearRegression(testSamples, confidence);

		if (!de::inRange(0.0f, nullParam.coefficientConfidenceLower, nullParam.coefficientConfidenceUpper))
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Constant operation sequence duration not constant");
			log << TestLog::Message << "Constant operation sequence timing may vary as a function of workload. Result quality extremely low" << TestLog::EndMessage;
		}

		if (de::inRange(0.0f, baseParam.coefficientConfidenceLower, baseParam.coefficientConfidenceUpper))
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Workload has no effect on duration");
			log << TestLog::Message << "Workload factor has no effect on duration of sample (smart optimizer?)" << TestLog::EndMessage;
		}

		log << TestLog::Section("Linear Regression", "Linear Regression");
		log << TestLog::Message << "Offset & coefficient presented as [confidence interval min, estimate, confidence interval max]. Reported confidence interval for this test is " << confidence << TestLog::EndMessage;

		log << TestLog::Message << "Render time for empty scene was\n\t"
			<< "[" << nullParam.offsetConfidenceLower << ", " << nullParam.offset <<  ", " << nullParam.offsetConfidenceUpper << "]us +"
			<< "[" << nullParam.coefficientConfidenceLower << ", " << nullParam.coefficient << ", " << nullParam.coefficientConfidenceUpper << "]"
			<< "us/workload" << TestLog::EndMessage;

		log << TestLog::Message << "Render time for scene without depth test was\n\t"
			<< "[" << baseParam.offsetConfidenceLower << ", " << baseParam.offset <<  ", " << baseParam.offsetConfidenceUpper << "]us +"
			<< "[" << baseParam.coefficientConfidenceLower << ", " << baseParam.coefficient << ", " << baseParam.coefficientConfidenceUpper << "]"
			<< "us/workload" << TestLog::EndMessage;

		log << TestLog::Message << "Render time for scene with depth test was\n\t"
			<< "[" << testParam.offsetConfidenceLower << ", " << testParam.offset <<  ", " << testParam.offsetConfidenceUpper << "]us +"
			<< "[" << testParam.coefficientConfidenceLower << ", " << testParam.coefficient << ", " << testParam.coefficientConfidenceUpper << "]"
			<< "us/workload" << TestLog::EndMessage;

		log << TestLog::EndSection;

		if (de::inRange(0.0f, testParam.coefficientConfidenceLower, testParam.coefficientConfidenceUpper))
		{
			log << TestLog::Message << "Test duration not dependent on culled workload" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, "0.0");
		}
		else if (testParam.coefficientConfidenceLower < testParam.coefficientConfidenceUpper*0.25)
		{
			log << TestLog::Message << "Coefficient confidence range is extremely large, cannot give reliable result" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, "Result confidence extremely low");
		}
		else if (baseParam.coefficientConfidenceLower < baseParam.coefficientConfidenceUpper*0.25)
		{
			log << TestLog::Message << "Coefficient confidence range for base render time is extremely large, cannot give reliable result" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, "Result confidence extremely low");
		}
		else
		{
			log << TestLog::Message << "Test duration is dependent on culled workload" << TestLog::EndMessage;
			m_results.addResult(QP_TEST_RESULT_PASS, de::floatToString(de::abs(testParam.coefficient)/de::abs(baseParam.coefficient), 2));
		}
	}
}